

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender __thiscall
fmt::v10::detail::write<char,fmt::v10::appender>
          (detail *this,appender out,basic_string_view<char> s,format_specs<char> *specs)

{
  basic_string_view<char> str;
  type tVar1;
  appender aVar2;
  char *n;
  string_view s_00;
  anon_class_40_4_6b3cdfe0 local_c0;
  size_t local_98;
  string_view local_90;
  format_specs<char> *local_80;
  char *local_78;
  counting_iterator local_70;
  counting_iterator local_68;
  size_t local_60;
  size_t width;
  format_specs<char> *pfStack_50;
  bool is_debug;
  char *local_48;
  ulong local_40;
  size_t size;
  char *data;
  format_specs<char> *specs_local;
  basic_string_view<char> s_local;
  appender out_local;
  
  n = (char *)s.size_;
  s_local.data_ = s.data_;
  data = n;
  specs_local = (format_specs<char> *)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  s_local.size_ = (size_t)this;
  size = (size_t)basic_string_view<char>::data((basic_string_view<char> *)&specs_local);
  local_40 = basic_string_view<char>::size((basic_string_view<char> *)&specs_local);
  if ((-1 < *(int *)(data + 4)) && (tVar1 = to_unsigned<int>(*(int *)(data + 4)), tVar1 < local_40))
  {
    pfStack_50 = specs_local;
    local_48 = s_local.data_;
    tVar1 = to_unsigned<int>(*(int *)(data + 4));
    s_00.size_._0_4_ = tVar1;
    s_00.data_ = local_48;
    s_00.size_._4_4_ = 0;
    local_40 = code_point_index((detail *)pfStack_50,s_00,(size_t)n);
  }
  width._7_1_ = data[8] == '\x12';
  local_60 = 0;
  if (*(int *)data != 0) {
    if ((bool)width._7_1_) {
      counting_iterator::counting_iterator(&local_70);
      local_80 = specs_local;
      local_78 = s_local.data_;
      str.size_ = (size_t)s_local.data_;
      str.data_ = (char *)specs_local;
      local_68 = write_escaped_string<char,fmt::v10::detail::counting_iterator>(local_70,str);
      local_60 = counting_iterator::count(&local_68);
    }
    else {
      basic_string_view<char>::basic_string_view(&local_90,(char *)size,local_40);
      local_60 = compute_width(local_90);
    }
  }
  local_98 = s_local.size_;
  local_c0.is_debug = (bool)(width._7_1_ & 1);
  local_c0.s.data_ = (char *)specs_local;
  local_c0.s.size_ = (size_t)s_local.data_;
  local_c0.data = (char *)size;
  local_c0.size = local_40;
  aVar2 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write<char,fmt::v10::appender>(fmt::v10::appender,fmt::v10::basic_string_view<char>,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_>
                    ((appender)s_local.size_,(format_specs<char> *)data,local_40,local_60,&local_c0)
  ;
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const format_specs<Char>& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  bool is_debug = specs.type == presentation_type::debug;
  size_t width = 0;
  if (specs.width != 0) {
    if (is_debug)
      width = write_escaped_string(counting_iterator{}, s).count();
    else
      width = compute_width(basic_string_view<Char>(data, size));
  }
  return write_padded(out, specs, size, width,
                      [=](reserve_iterator<OutputIt> it) {
                        if (is_debug) return write_escaped_string(it, s);
                        return copy_str<Char>(data, data + size, it);
                      });
}